

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetOneofFieldDescriptor
          (GeneratedMessageReflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  uint32 key;
  uint32 field_number;
  OneofDescriptor *oneof_descriptor_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  key = GetOneofCase(this,message,oneof_descriptor);
  if (key == 0) {
    this_local = (GeneratedMessageReflection *)0x0;
  }
  else {
    this_local = (GeneratedMessageReflection *)Descriptor::FindFieldByNumber(this->descriptor_,key);
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* GeneratedMessageReflection::GetOneofFieldDescriptor(
    const Message& message,
    const OneofDescriptor* oneof_descriptor) const {
  uint32 field_number = GetOneofCase(message, oneof_descriptor);
  if (field_number == 0) {
    return NULL;
  }
  return descriptor_->FindFieldByNumber(field_number);
}